

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::fillEventVectorUpTo(FederateState *this,Time currentTime)

{
  bool bVar1;
  const_iterator __x;
  long in_RDI;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *ept;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  handle *__range1_1;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *ipt;
  const_iterator __end1;
  const_iterator __begin1;
  handle *__range1;
  InterfaceInfo *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  value_type *in_stack_ffffffffffffff18;
  vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
  *in_stack_ffffffffffffff20;
  vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *this_00;
  __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
  local_88 [2];
  InputInfo *in_stack_ffffffffffffff88;
  Time in_stack_ffffffffffffff90;
  EndpointInfo *in_stack_ffffffffffffffb8;
  Time in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
  local_38;
  undefined1 local_30 [24];
  undefined1 *local_18;
  
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::clear
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)0x58e630);
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::clear
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)0x58e641);
  InterfaceInfo::getInputs_abi_cxx11_(in_stack_ffffffffffffff08);
  local_18 = local_30;
  local_38._M_current =
       (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
       gmlc::libguarded::
       lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
       ::begin((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)in_stack_ffffffffffffff08);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::end((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
         *)in_stack_ffffffffffffff08);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                            (__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                             *)in_stack_ffffffffffffff08), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
    ::operator*(&local_38);
    std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
              ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)0x58e720);
    bVar1 = InputInfo::updateTimeUpTo(in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
    if (bVar1) {
      std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
                ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)0x58e76d)
      ;
      std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
    ::operator++(&local_38);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x58e6d3);
  this_00 = (vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)
            (local_88 + 1);
  InterfaceInfo::getEndpoints_abi_cxx11_(in_stack_ffffffffffffff08);
  local_88[0]._M_current =
       (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
       gmlc::libguarded::
       lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
       ::begin((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)in_stack_ffffffffffffff08);
  __x = gmlc::libguarded::
        lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
        ::end((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
               *)in_stack_ffffffffffffff08);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                            (__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                             *)in_stack_ffffffffffffff08), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator*(local_88);
    std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::operator->
              ((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
               0x58e857);
    in_stack_ffffffffffffff17 =
         EndpointInfo::updateTimeUpTo(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
    if ((bool)in_stack_ffffffffffffff17) {
      in_stack_ffffffffffffff08 = (InterfaceInfo *)(in_RDI + 0x4d8);
      std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::operator->
                ((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
                 0x58e89a);
      std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                (this_00,(value_type *)__x._M_current);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator++(local_88);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x58e816);
  return;
}

Assistant:

void FederateState::fillEventVectorUpTo(Time currentTime)
{
    events.clear();
    eventMessages.clear();
    for (const auto& ipt : interfaceInformation.getInputs()) {
        if (ipt->updateTimeUpTo(currentTime)) {
            events.push_back(ipt->id.handle);
        }
    }
    for (const auto& ept : interfaceInformation.getEndpoints()) {
        if (ept->updateTimeUpTo(currentTime)) {
            eventMessages.push_back(ept->id.handle);
        }
    }
}